

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O1

Vec_Int_t * Gia_ManStgReadLines(char *pFileName,int *pnIns,int *pnOuts,int *pnStates)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  FILE *__stream;
  Vec_Int_t *p;
  int *piVar5;
  char *pcVar6;
  char pBuffer [1000];
  int local_438;
  int local_434;
  char local_418 [1000];
  
  sVar4 = strlen(pFileName);
  iVar1 = strcmp(pFileName + (sVar4 - 3),"aig");
  if (iVar1 == 0) {
    p = (Vec_Int_t *)0x0;
    printf("Input file \"%s\" has extension \"%s\".\n",pFileName,"aig");
  }
  else {
    __stream = fopen(pFileName,"rb");
    if (__stream == (FILE *)0x0) {
      p = (Vec_Int_t *)0x0;
      printf("Cannot open file \"%s\".\n",pFileName);
    }
    else {
      p = (Vec_Int_t *)malloc(0x10);
      p->nCap = 1000;
      p->nSize = 0;
      piVar5 = (int *)malloc(4000);
      p->pArray = piVar5;
      pcVar6 = fgets(local_418,1000,__stream);
      if (pcVar6 == (char *)0x0) {
        local_434 = -1;
        local_438 = -1;
        iVar1 = 1;
      }
      else {
        local_438 = -1;
        local_434 = -1;
        iVar3 = 1;
        do {
          while ((local_418[0] != '.' && (local_418[0] != '#'))) {
            pcVar6 = strtok(local_418," \r\n");
            sVar4 = strlen(pcVar6);
            iVar1 = (int)sVar4;
            if ((local_434 != -1) && (iVar1 = local_434, local_434 != (int)sVar4)) {
              __assert_fail("nInputs == (int)strlen(pToken)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStg.c"
                            ,0x1d4,"Vec_Int_t *Gia_ManStgReadLines(char *, int *, int *, int *)");
            }
            local_434 = iVar1;
            uVar2 = Extra_ReadBinary(pcVar6);
            Vec_IntPush(p,uVar2);
            pcVar6 = strtok((char *)0x0," \r\n");
            iVar1 = atoi(pcVar6);
            Vec_IntPush(p,iVar1);
            if ((long)p->nSize < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
            }
            iVar1 = p->pArray[(long)p->nSize + -1] + 1;
            if (iVar1 < iVar3) {
              iVar1 = iVar3;
            }
            pcVar6 = strtok((char *)0x0," \r\n");
            iVar3 = atoi(pcVar6);
            Vec_IntPush(p,iVar3);
            pcVar6 = strtok((char *)0x0," \r\n");
            sVar4 = strlen(pcVar6);
            iVar3 = (int)sVar4;
            if ((local_438 != -1) && (iVar3 = local_438, local_438 != (int)sVar4)) {
              __assert_fail("nOutputs == (int)strlen(pToken)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStg.c"
                            ,0x1e3,"Vec_Int_t *Gia_ManStgReadLines(char *, int *, int *, int *)");
            }
            local_438 = iVar3;
            uVar2 = Extra_ReadBinary(pcVar6);
            Vec_IntPush(p,uVar2);
            pcVar6 = fgets(local_418,1000,__stream);
            iVar3 = iVar1;
            if (pcVar6 == (char *)0x0) goto LAB_007c4906;
          }
          pcVar6 = fgets(local_418,1000,__stream);
          iVar1 = iVar3;
        } while (pcVar6 != (char *)0x0);
      }
LAB_007c4906:
      fclose(__stream);
      if (pnIns != (int *)0x0) {
        *pnIns = local_434;
      }
      if (pnOuts != (int *)0x0) {
        *pnOuts = local_438;
      }
      if (pnStates != (int *)0x0) {
        *pnStates = iVar1;
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_ManStgReadLines( char * pFileName, int * pnIns, int * pnOuts, int * pnStates )
{
    Vec_Int_t * vLines;
    char pBuffer[1000];
    char * pToken;
    int Number, nInputs = -1, nOutputs = -1, nStates = 1;
    FILE * pFile;
    if ( !strcmp(pFileName + strlen(pFileName) - 3, "aig") )
    {
        printf( "Input file \"%s\" has extension \"%s\".\n", pFileName, "aig" );
        return NULL;
    }
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    vLines = Vec_IntAlloc( 1000 );
    while ( fgets( pBuffer, 1000, pFile ) != NULL )
    {
        if ( pBuffer[0] == '.' || pBuffer[0] == '#' )
            continue;
        // read condition
        pToken = strtok( pBuffer, " \r\n" );
        if ( nInputs == -1 )
            nInputs = strlen(pToken);
        else
            assert( nInputs == (int)strlen(pToken) );
        Number = Extra_ReadBinary( pToken );
        Vec_IntPush( vLines, Number );
        // read current state
        pToken = strtok( NULL, " \r\n" );
        Vec_IntPush( vLines, atoi(pToken) );
        nStates = Abc_MaxInt( nStates, Vec_IntEntryLast(vLines)+1 );
        // read next state
        pToken = strtok( NULL, " \r\n" );
        Vec_IntPush( vLines, atoi(pToken) );
        // read output
        pToken = strtok( NULL, " \r\n" );
        if ( nOutputs == -1 )
            nOutputs = strlen(pToken);
        else
            assert( nOutputs == (int)strlen(pToken) );
        Number = Extra_ReadBinary( pToken );
        Vec_IntPush( vLines, Number );
    }
    fclose( pFile );
    if ( pnIns )
        *pnIns = nInputs;
    if ( pnOuts )
        *pnOuts = nOutputs;
    if ( pnStates )
        *pnStates = nStates;
    return vLines;
}